

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

int convolve_layer(void *arg1,void *arg2)

{
  CONVOLVE_OPS *convolve_ops;
  int in_stack_0000003c;
  int in_stack_00000040;
  int in_stack_00000044;
  float **in_stack_00000048;
  int in_stack_00000080;
  int in_stack_00000088;
  int in_stack_00000090;
  
  av1_cnn_convolve(in_stack_00000048,in_stack_00000044,in_stack_00000040,in_stack_0000003c,
                   (CNN_LAYER_CONFIG *)arg1,(float **)arg2,in_stack_00000080,in_stack_00000088,
                   in_stack_00000090);
  return 1;
}

Assistant:

static int convolve_layer(void *arg1, void *arg2) {
  const CONVOLVE_OPS *convolve_ops = arg1;
  (void)arg2;
  av1_cnn_convolve(
      convolve_ops->input, convolve_ops->in_width, convolve_ops->in_height,
      convolve_ops->in_stride, convolve_ops->layer_config, convolve_ops->output,
      convolve_ops->out_stride, convolve_ops->start_idx, convolve_ops->th_step);
  return 1;
}